

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumBlock
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  bool bVar3;
  long *local_50 [2];
  long local_40 [2];
  
  bVar2 = ConsumeEndOfDeclaration(this,"{",enum_location);
  if (bVar2) {
    bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    bVar3 = true;
    while (!bVar2) {
      if ((this->input_->current_).type == TYPE_END) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Reached end of input in enum definition (missing \'}\').","")
        ;
        pEVar1 = this->error_collector_;
        if (pEVar1 != (ErrorCollector *)0x0) {
          (*pEVar1->_vptr_ErrorCollector[2])
                    (pEVar1,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column,local_50);
        }
        this->had_errors_ = true;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        goto LAB_002d0b36;
      }
      bVar2 = ParseEnumStatement(this,enum_type,enum_location,containing_file);
      if (!bVar2) {
        SkipStatement(this);
      }
      bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    }
  }
  else {
LAB_002d0b36:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Parser::ParseEnumBlock(EnumDescriptorProto* enum_type,
                            const LocationRecorder& enum_location,
                            const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &enum_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in enum definition (missing '}').");
      return false;
    }

    if (!ParseEnumStatement(enum_type, enum_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  return true;
}